

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_swap_Nbytes(size_t n,int siz,void *ar)

{
  ushort *puVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 *puVar4;
  size_t sVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  
  switch(siz - 2U >> 1 | (uint)((siz - 2U & 1) != 0) << 0x1f) {
  case 0:
    if (n != 0) {
      sVar5 = 0;
      do {
        puVar1 = (ushort *)((long)ar + sVar5 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        sVar5 = sVar5 + 1;
      } while (n != sVar5);
    }
    break;
  case 1:
    if (n != 0) {
      sVar5 = 0;
      do {
        uVar2 = *(undefined1 *)((long)ar + sVar5 * 4);
        *(undefined1 *)((long)ar + sVar5 * 4) = *(undefined1 *)((long)ar + sVar5 * 4 + 3);
        *(undefined1 *)((long)ar + sVar5 * 4 + 3) = uVar2;
        puVar1 = (ushort *)((long)ar + sVar5 * 4 + 1);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        sVar5 = sVar5 + 1;
      } while (n != sVar5);
    }
    break;
  default:
    fprintf(_stderr,"** NIfTI: cannot swap in %d byte blocks\n",siz);
    return;
  case 3:
    if (n != 0) {
      puVar4 = (undefined1 *)((long)ar + 1);
      sVar5 = 0;
      do {
        puVar6 = (undefined1 *)((long)ar + 7);
        puVar7 = puVar4;
        do {
          uVar2 = puVar7[-1];
          puVar7[-1] = *puVar6;
          *puVar6 = uVar2;
          puVar6 = puVar6 + -1;
          bVar3 = puVar7 < puVar6;
          puVar7 = puVar7 + 1;
        } while (bVar3);
        ar = (void *)((long)ar + 8);
        sVar5 = sVar5 + 1;
        puVar4 = puVar4 + 8;
      } while (sVar5 != n);
    }
    break;
  case 7:
    if (n != 0) {
      puVar4 = (undefined1 *)((long)ar + 1);
      sVar5 = 0;
      do {
        puVar6 = (undefined1 *)((long)ar + 0xf);
        puVar7 = puVar4;
        do {
          uVar2 = puVar7[-1];
          puVar7[-1] = *puVar6;
          *puVar6 = uVar2;
          puVar6 = puVar6 + -1;
          bVar3 = puVar7 < puVar6;
          puVar7 = puVar7 + 1;
        } while (bVar3);
        ar = (void *)((long)ar + 0x10);
        sVar5 = sVar5 + 1;
        puVar4 = puVar4 + 0x10;
      } while (sVar5 != n);
    }
  }
  return;
}

Assistant:

void nifti_swap_Nbytes( size_t n , int siz , void *ar )  /* subsuming case */
{
   switch( siz ){
     case 2:  nifti_swap_2bytes ( n , ar ) ; break ;
     case 4:  nifti_swap_4bytes ( n , ar ) ; break ;
     case 8:  nifti_swap_8bytes ( n , ar ) ; break ;
     case 16: nifti_swap_16bytes( n , ar ) ; break ;
     default:    /* nifti_swap_bytes  ( n , siz, ar ) ; */
        fprintf(stderr,"** NIfTI: cannot swap in %d byte blocks\n", siz);
        break ;
   }
   return ;
}